

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

ActionResult * __thiscall
spectest::CommandRunner::RunAction
          (ActionResult *__return_storage_ptr__,CommandRunner *this,int line_number,Action *action,
          RunVerbosity verbose)

{
  ExportMap *this_00;
  mapped_type *other;
  Func *this_01;
  Global *pGVar1;
  string_view name;
  Ptr extern_;
  Ptr *in_stack_ffffffffffffff90;
  RefPtr<wabt::interp::Extern> local_60;
  anon_union_16_6_113bff37_for_Value_0 local_48;
  undefined8 local_38;
  
  if ((action->module_name)._M_string_length == 0) {
    this_00 = &this->last_instance_;
  }
  else {
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>_>_>_>
              ::operator[](&this->instances_,&action->module_name);
  }
  other = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
          ::operator[](this_00,&action->field_name);
  wabt::interp::RefPtr<wabt::interp::Extern>::RefPtr(&local_60,other);
  if (local_60.obj_ == (Extern *)0x0) {
    PrintError(this,line_number,"unknown invoke \"%s.%s\"",(action->module_name)._M_dataplus._M_p,
               (action->field_name)._M_dataplus._M_p);
    (__return_storage_ptr__->trap).obj_ = (Trap *)0x0;
    (__return_storage_ptr__->trap).store_ = (Store *)0x0;
    (__return_storage_ptr__->values).
    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->values).
    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->values).
    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->trap).root_index_ = 0;
  }
  else {
    (__return_storage_ptr__->trap).obj_ = (Trap *)0x0;
    (__return_storage_ptr__->trap).store_ = (Store *)0x0;
    (__return_storage_ptr__->values).
    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->values).
    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->trap).root_index_ = 0;
    (__return_storage_ptr__->types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->values).
    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (action->type == Get) {
      pGVar1 = wabt::cast<wabt::interp::Global,wabt::interp::Extern>(local_60.obj_);
      local_38 = *(undefined8 *)&(pGVar1->value_).type;
      local_48.i64_ = (pGVar1->value_).field_0.i64_;
      local_48._8_8_ = *(undefined8 *)((long)&(pGVar1->value_).field_0 + 8);
      std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::
      emplace_back<wabt::interp::Value>(&__return_storage_ptr__->values,(Value *)&local_48.v128_);
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::push_back
                (&__return_storage_ptr__->types,
                 (value_type *)&(pGVar1->type_).super_ExternType.field_0xc);
    }
    else {
      if (action->type != Invoke) {
        abort();
      }
      this_01 = wabt::cast<wabt::interp::Func,wabt::interp::Extern>(local_60.obj_);
      wabt::interp::Func::Call
                (this_01,&this->store_,&action->args,&__return_storage_ptr__->values,
                 &__return_storage_ptr__->trap,s_trace_stream);
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
                (&__return_storage_ptr__->types,&(this_01->type_).results);
      if (verbose == Verbose) {
        name.size_ = (size_type)&this_01->type_;
        name.data_ = (char *)(action->field_name)._M_string_length;
        wabt::interp::WriteCall
                  ((interp *)
                   s_stdout_stream._M_t.
                   super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                   .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl,
                   (Stream *)(action->field_name)._M_dataplus._M_p,name,(FuncType *)&action->args,
                   &__return_storage_ptr__->values,(Values *)&__return_storage_ptr__->trap,
                   in_stack_ffffffffffffff90);
      }
    }
  }
  wabt::interp::RefPtr<wabt::interp::Extern>::reset(&local_60);
  return __return_storage_ptr__;
}

Assistant:

ActionResult CommandRunner::RunAction(int line_number,
                                      const Action* action,
                                      RunVerbosity verbose) {
  ExportMap& module = !action->module_name.empty()
                          ? instances_[action->module_name]
                          : last_instance_;
  Extern::Ptr extern_ = module[action->field_name];
  if (!extern_) {
    PrintError(line_number, "unknown invoke \"%s.%s\"",
               action->module_name.c_str(), action->field_name.c_str());
    return {};
  }

  ActionResult result;

  switch (action->type) {
    case ActionType::Invoke: {
      auto* func = cast<interp::Func>(extern_.get());
      func->Call(store_, action->args, result.values, &result.trap,
                 s_trace_stream);
      result.types = func->type().results;
      if (verbose == RunVerbosity::Verbose) {
        WriteCall(s_stdout_stream.get(), action->field_name, func->type(),
                  action->args, result.values, result.trap);
      }
      break;
    }

    case ActionType::Get: {
      auto* global = cast<interp::Global>(extern_.get());
      result.values.push_back(global->Get());
      result.types.push_back(global->type().type);
      break;
    }

    default:
      WABT_UNREACHABLE;
  }

  return result;
}